

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::genTessLevelCases
          (vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
           *__return_storage_ptr__,InvarianceTestInstance *this)

{
  undefined8 uVar1;
  int i;
  int iVar2;
  int j;
  long lVar3;
  float fVar4;
  TessLevels levels;
  Random rnd;
  value_type local_78;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  deRandom local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  do {
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.levels.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    *(undefined8 *)
     ((local_78.levels.
       super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
       ._M_impl.super__Vector_impl_data._M_start)->outer + 2) =
         *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].outer + lVar3 + 8);
    uVar1 = *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].outer + lVar3);
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->inner =
         *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].inner + lVar3);
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->outer = uVar1;
    local_78.mem = 0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.levels.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_78);
    if (local_78.levels.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.levels.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.levels.
                            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.levels.
                            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xd8);
  deRandom_init(&local_38,0x7b);
  iVar2 = 0;
  do {
    lVar3 = 0;
    do {
      fVar4 = deRandom_getFloat(&local_38);
      *(float *)((long)&local_50 + lVar3 * 4) = fVar4 * 15.0 + 1.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar3 = 2;
    do {
      fVar4 = deRandom_getFloat(&local_38);
      *(float *)((long)&local_50 + lVar3 * 4) = fVar4 * 15.0 + 1.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.levels.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    *(undefined8 *)
     ((local_78.levels.
       super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
       ._M_impl.super__Vector_impl_data._M_start)->outer + 2) = local_40;
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->inner = local_50;
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->outer = uStack_48;
    local_78.mem = 0;
    local_78.levels.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.levels.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_78);
    if (local_78.levels.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.levels.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.levels.
                            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.levels.
                            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 10);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> InvarianceTestInstance::genTessLevelCases (void) const
{
	static const TessLevels basicTessLevelCases[] =
	{
		{ { 1.0f,	1.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 63.0f,	24.0f	},	{ 15.0f,	42.0f,	10.0f,	12.0f	} },
		{ { 3.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 4.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 2.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 5.0f,	6.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 1.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.0f,	1.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.2f,	1.6f	},	{ 2.9f,		3.4f,	1.5f,	4.1f	} }
	};

	std::vector<LevelCase> result;
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(basicTessLevelCases); ++i)
		result.push_back(LevelCase(basicTessLevelCases[i]));

	{
		de::Random rnd(123);
		for (int i = 0; i < 10; ++i)
		{
			TessLevels levels;
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.inner); ++j)
				levels.inner[j] = rnd.getFloat(1.0f, 16.0f);
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.outer); ++j)
				levels.outer[j] = rnd.getFloat(1.0f, 16.0f);
			result.push_back(LevelCase(levels));
		}
	}

	return result;
}